

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O2

int __thiscall banksia::ChessBoard::toPieceCount(ChessBoard *this,int *pieceCnt)

{
  Piece PVar1;
  int i;
  int pos;
  int iVar2;
  
  if (pieceCnt != (int *)0x0) {
    pieceCnt[8] = 0;
    pieceCnt[9] = 0;
    pieceCnt[10] = 0;
    pieceCnt[0xb] = 0;
    pieceCnt[4] = 0;
    pieceCnt[5] = 0;
    pieceCnt[6] = 0;
    pieceCnt[7] = 0;
    pieceCnt[0] = 0;
    pieceCnt[1] = 0;
    pieceCnt[2] = 0;
    pieceCnt[3] = 0;
    pieceCnt[0xc] = 0;
    pieceCnt[0xd] = 0;
  }
  iVar2 = 0;
  for (pos = 0; pos != 0x40; pos = pos + 1) {
    PVar1 = BoardCore::getPiece(&this->super_BoardCore,pos);
    if (PVar1.type != empty) {
      iVar2 = iVar2 + 1;
      if (pieceCnt != (int *)0x0) {
        pieceCnt[(int)(PVar1.type + PVar1.side * 7)] =
             pieceCnt[(int)(PVar1.type + PVar1.side * 7)] + 1;
      }
    }
  }
  return iVar2;
}

Assistant:

int ChessBoard::toPieceCount(int* pieceCnt) const
{
    if (pieceCnt) {
        memset(pieceCnt, 0, 14 * sizeof(int));
    }
    auto totalCnt = 0;;
    for(int i = 0; i < 64; i++) {
        auto piece = getPiece(i);
        if (piece.isEmpty()) continue;
        totalCnt++;
        auto sd = static_cast<int>(piece.side), type = static_cast<int>(piece.type);
        if (pieceCnt) {
            pieceCnt[sd * 7 + type]++;
        }
    }

    assert(totalCnt >= 2 && totalCnt <= 32);
    return totalCnt;
}